

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall sentencepiece::TrainerSpec::MergeFrom(TrainerSpec *this,TrainerSpec *from)

{
  uint uVar1;
  LogMessage *other;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar2;
  string *psVar3;
  InternalMetadata *this_00;
  LogFinisher local_11d;
  uint32 cached_has_bits;
  byte local_109;
  LogMessage local_108;
  TrainerSpec *local_d0;
  TrainerSpec *from_local;
  TrainerSpec *this_local;
  InternalMetadata *local_b8;
  undefined4 local_4c;
  HasBits<2UL> *local_48;
  InternalMetadata *local_40;
  undefined8 local_38;
  InternalMetadata *local_30;
  string *local_28;
  InternalMetadata *local_20;
  InternalMetadata *local_18;
  InternalMetadata *local_10;
  
  local_109 = 0;
  local_d0 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_108,LOGLEVEL_DFATAL,"src/builtin_pb/sentencepiece_model.pb.cc",0x6ac);
    local_109 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_108,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_11d,other);
  }
  if ((local_109 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_108);
  }
  google::protobuf::internal::ExtensionSet::MergeFrom(&this->_extensions_,&local_d0->_extensions_);
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  this_local = (TrainerSpec *)&(local_d0->super_MessageLite)._internal_metadata_;
  local_b8 = this_00;
  local_40 = (InternalMetadata *)this_local;
  local_10 = (InternalMetadata *)this_local;
  if (((uint)((InternalMetadata *)this_local)->ptr_ & 1) == 1) {
    local_38 = 0;
    local_30 = (InternalMetadata *)this_local;
    local_20 = (InternalMetadata *)this_local;
    local_18 = (InternalMetadata *)this_local;
    if (((uint)((InternalMetadata *)this_local)->ptr_ & 1) == 1) {
      pCVar2 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                         ((InternalMetadata *)this_local);
      local_28 = &pCVar2->unknown_fields;
    }
    else {
      local_28 = (string *)(*(code *)0x0)();
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (this_00,local_28);
  }
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&this->input_,&local_d0->input_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&this->accept_language_,&local_d0->accept_language_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&this->control_symbols_,&local_d0->control_symbols_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(&this->user_defined_symbols_,&local_d0->user_defined_symbols_);
  local_48 = &local_d0->_has_bits_;
  local_4c = 0;
  uVar1 = local_48->has_bits_[0];
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar3 = _internal_model_prefix_abi_cxx11_(local_d0);
      _internal_set_model_prefix(this,psVar3);
    }
    if ((uVar1 & 2) != 0) {
      psVar3 = _internal_input_format_abi_cxx11_(local_d0);
      _internal_set_input_format(this,psVar3);
    }
    if ((uVar1 & 4) != 0) {
      psVar3 = _internal_required_chars_abi_cxx11_(local_d0);
      _internal_set_required_chars(this,psVar3);
    }
    if ((uVar1 & 8) != 0) {
      psVar3 = _internal_unk_surface_abi_cxx11_(local_d0);
      _internal_set_unk_surface(this,psVar3);
    }
    if ((uVar1 & 0x10) != 0) {
      psVar3 = _internal_unk_piece_abi_cxx11_(local_d0);
      _internal_set_unk_piece(this,psVar3);
    }
    if ((uVar1 & 0x20) != 0) {
      psVar3 = _internal_bos_piece_abi_cxx11_(local_d0);
      _internal_set_bos_piece(this,psVar3);
    }
    if ((uVar1 & 0x40) != 0) {
      psVar3 = _internal_eos_piece_abi_cxx11_(local_d0);
      _internal_set_eos_piece(this,psVar3);
    }
    if ((uVar1 & 0x80) != 0) {
      psVar3 = _internal_pad_piece_abi_cxx11_(local_d0);
      _internal_set_pad_piece(this,psVar3);
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 & 0x100) != 0) {
      psVar3 = _internal_pretokenization_delimiter_abi_cxx11_(local_d0);
      _internal_set_pretokenization_delimiter(this,psVar3);
    }
    if ((uVar1 & 0x200) != 0) {
      psVar3 = _internal_seed_sentencepieces_file_abi_cxx11_(local_d0);
      _internal_set_seed_sentencepieces_file(this,psVar3);
    }
    if ((uVar1 & 0x400) != 0) {
      this->self_test_sample_size_ = local_d0->self_test_sample_size_;
    }
    if ((uVar1 & 0x800) != 0) {
      this->mining_sentence_size_ = local_d0->mining_sentence_size_;
    }
    if ((uVar1 & 0x1000) != 0) {
      this->input_sentence_size_ = local_d0->input_sentence_size_;
    }
    if ((uVar1 & 0x2000) != 0) {
      this->training_sentence_size_ = local_d0->training_sentence_size_;
    }
    if ((uVar1 & 0x4000) != 0) {
      this->enable_differential_privacy_ = (bool)(local_d0->enable_differential_privacy_ & 1);
    }
    if ((uVar1 & 0x8000) != 0) {
      this->treat_whitespace_as_suffix_ = (bool)(local_d0->treat_whitespace_as_suffix_ & 1);
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  if ((uVar1 & 0xff0000) != 0) {
    if ((uVar1 & 0x10000) != 0) {
      this->allow_whitespace_only_pieces_ = (bool)(local_d0->allow_whitespace_only_pieces_ & 1);
    }
    if ((uVar1 & 0x20000) != 0) {
      this->split_digits_ = (bool)(local_d0->split_digits_ & 1);
    }
    if ((uVar1 & 0x40000) != 0) {
      this->byte_fallback_ = (bool)(local_d0->byte_fallback_ & 1);
    }
    if ((uVar1 & 0x80000) != 0) {
      this->use_all_vocab_ = (bool)(local_d0->use_all_vocab_ & 1);
    }
    if ((uVar1 & 0x100000) != 0) {
      this->train_extremely_large_corpus_ = (bool)(local_d0->train_extremely_large_corpus_ & 1);
    }
    if ((uVar1 & 0x200000) != 0) {
      this->unk_id_ = local_d0->unk_id_;
    }
    if ((uVar1 & 0x400000) != 0) {
      this->differential_privacy_noise_level_ = local_d0->differential_privacy_noise_level_;
    }
    if ((uVar1 & 0x800000) != 0) {
      this->differential_privacy_clipping_threshold_ =
           local_d0->differential_privacy_clipping_threshold_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  if ((uVar1 & 0xff000000) != 0) {
    if ((uVar1 & 0x1000000) != 0) {
      this->model_type_ = local_d0->model_type_;
    }
    if ((uVar1 & 0x2000000) != 0) {
      this->vocab_size_ = local_d0->vocab_size_;
    }
    if ((uVar1 & 0x4000000) != 0) {
      this->character_coverage_ = local_d0->character_coverage_;
    }
    if ((uVar1 & 0x8000000) != 0) {
      this->seed_sentencepiece_size_ = local_d0->seed_sentencepiece_size_;
    }
    if ((uVar1 & 0x10000000) != 0) {
      this->shrinking_factor_ = local_d0->shrinking_factor_;
    }
    if ((uVar1 & 0x20000000) != 0) {
      this->num_threads_ = local_d0->num_threads_;
    }
    if ((uVar1 & 0x40000000) != 0) {
      this->num_sub_iterations_ = local_d0->num_sub_iterations_;
    }
    if ((uVar1 & 0x80000000) != 0) {
      this->max_sentence_length_ = local_d0->max_sentence_length_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  uVar1 = (local_d0->_has_bits_).has_bits_[1];
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      this->max_sentencepiece_length_ = local_d0->max_sentencepiece_length_;
    }
    if ((uVar1 & 2) != 0) {
      this->shuffle_input_sentence_ = (bool)(local_d0->shuffle_input_sentence_ & 1);
    }
    if ((uVar1 & 4) != 0) {
      this->split_by_unicode_script_ = (bool)(local_d0->split_by_unicode_script_ & 1);
    }
    if ((uVar1 & 8) != 0) {
      this->split_by_number_ = (bool)(local_d0->split_by_number_ & 1);
    }
    if ((uVar1 & 0x10) != 0) {
      this->split_by_whitespace_ = (bool)(local_d0->split_by_whitespace_ & 1);
    }
    if ((uVar1 & 0x20) != 0) {
      this->vocabulary_output_piece_score_ = (bool)(local_d0->vocabulary_output_piece_score_ & 1);
    }
    if ((uVar1 & 0x40) != 0) {
      this->hard_vocab_limit_ = (bool)(local_d0->hard_vocab_limit_ & 1);
    }
    if ((uVar1 & 0x80) != 0) {
      this->bos_id_ = local_d0->bos_id_;
    }
    (this->_has_bits_).has_bits_[1] = uVar1 | (this->_has_bits_).has_bits_[1];
  }
  if ((uVar1 & 0x300) != 0) {
    if ((uVar1 & 0x100) != 0) {
      this->eos_id_ = local_d0->eos_id_;
    }
    if ((uVar1 & 0x200) != 0) {
      this->pad_id_ = local_d0->pad_id_;
    }
    (this->_has_bits_).has_bits_[1] = uVar1 | (this->_has_bits_).has_bits_[1];
  }
  return;
}

Assistant:

void TrainerSpec::MergeFrom(const TrainerSpec& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:sentencepiece.TrainerSpec)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  input_.MergeFrom(from.input_);
  accept_language_.MergeFrom(from.accept_language_);
  control_symbols_.MergeFrom(from.control_symbols_);
  user_defined_symbols_.MergeFrom(from.user_defined_symbols_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_model_prefix(from._internal_model_prefix());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_input_format(from._internal_input_format());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_required_chars(from._internal_required_chars());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_set_unk_surface(from._internal_unk_surface());
    }
    if (cached_has_bits & 0x00000010u) {
      _internal_set_unk_piece(from._internal_unk_piece());
    }
    if (cached_has_bits & 0x00000020u) {
      _internal_set_bos_piece(from._internal_bos_piece());
    }
    if (cached_has_bits & 0x00000040u) {
      _internal_set_eos_piece(from._internal_eos_piece());
    }
    if (cached_has_bits & 0x00000080u) {
      _internal_set_pad_piece(from._internal_pad_piece());
    }
  }
  if (cached_has_bits & 0x0000ff00u) {
    if (cached_has_bits & 0x00000100u) {
      _internal_set_pretokenization_delimiter(from._internal_pretokenization_delimiter());
    }
    if (cached_has_bits & 0x00000200u) {
      _internal_set_seed_sentencepieces_file(from._internal_seed_sentencepieces_file());
    }
    if (cached_has_bits & 0x00000400u) {
      self_test_sample_size_ = from.self_test_sample_size_;
    }
    if (cached_has_bits & 0x00000800u) {
      mining_sentence_size_ = from.mining_sentence_size_;
    }
    if (cached_has_bits & 0x00001000u) {
      input_sentence_size_ = from.input_sentence_size_;
    }
    if (cached_has_bits & 0x00002000u) {
      training_sentence_size_ = from.training_sentence_size_;
    }
    if (cached_has_bits & 0x00004000u) {
      enable_differential_privacy_ = from.enable_differential_privacy_;
    }
    if (cached_has_bits & 0x00008000u) {
      treat_whitespace_as_suffix_ = from.treat_whitespace_as_suffix_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 0x00ff0000u) {
    if (cached_has_bits & 0x00010000u) {
      allow_whitespace_only_pieces_ = from.allow_whitespace_only_pieces_;
    }
    if (cached_has_bits & 0x00020000u) {
      split_digits_ = from.split_digits_;
    }
    if (cached_has_bits & 0x00040000u) {
      byte_fallback_ = from.byte_fallback_;
    }
    if (cached_has_bits & 0x00080000u) {
      use_all_vocab_ = from.use_all_vocab_;
    }
    if (cached_has_bits & 0x00100000u) {
      train_extremely_large_corpus_ = from.train_extremely_large_corpus_;
    }
    if (cached_has_bits & 0x00200000u) {
      unk_id_ = from.unk_id_;
    }
    if (cached_has_bits & 0x00400000u) {
      differential_privacy_noise_level_ = from.differential_privacy_noise_level_;
    }
    if (cached_has_bits & 0x00800000u) {
      differential_privacy_clipping_threshold_ = from.differential_privacy_clipping_threshold_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 0xff000000u) {
    if (cached_has_bits & 0x01000000u) {
      model_type_ = from.model_type_;
    }
    if (cached_has_bits & 0x02000000u) {
      vocab_size_ = from.vocab_size_;
    }
    if (cached_has_bits & 0x04000000u) {
      character_coverage_ = from.character_coverage_;
    }
    if (cached_has_bits & 0x08000000u) {
      seed_sentencepiece_size_ = from.seed_sentencepiece_size_;
    }
    if (cached_has_bits & 0x10000000u) {
      shrinking_factor_ = from.shrinking_factor_;
    }
    if (cached_has_bits & 0x20000000u) {
      num_threads_ = from.num_threads_;
    }
    if (cached_has_bits & 0x40000000u) {
      num_sub_iterations_ = from.num_sub_iterations_;
    }
    if (cached_has_bits & 0x80000000u) {
      max_sentence_length_ = from.max_sentence_length_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  cached_has_bits = from._has_bits_[1];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      max_sentencepiece_length_ = from.max_sentencepiece_length_;
    }
    if (cached_has_bits & 0x00000002u) {
      shuffle_input_sentence_ = from.shuffle_input_sentence_;
    }
    if (cached_has_bits & 0x00000004u) {
      split_by_unicode_script_ = from.split_by_unicode_script_;
    }
    if (cached_has_bits & 0x00000008u) {
      split_by_number_ = from.split_by_number_;
    }
    if (cached_has_bits & 0x00000010u) {
      split_by_whitespace_ = from.split_by_whitespace_;
    }
    if (cached_has_bits & 0x00000020u) {
      vocabulary_output_piece_score_ = from.vocabulary_output_piece_score_;
    }
    if (cached_has_bits & 0x00000040u) {
      hard_vocab_limit_ = from.hard_vocab_limit_;
    }
    if (cached_has_bits & 0x00000080u) {
      bos_id_ = from.bos_id_;
    }
    _has_bits_[1] |= cached_has_bits;
  }
  if (cached_has_bits & 0x00000300u) {
    if (cached_has_bits & 0x00000100u) {
      eos_id_ = from.eos_id_;
    }
    if (cached_has_bits & 0x00000200u) {
      pad_id_ = from.pad_id_;
    }
    _has_bits_[1] |= cached_has_bits;
  }
}